

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

void __thiscall
wabt::SharedValidator::SharedValidator
          (SharedValidator *this,Errors *errors,ValidateOptions *options)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  anon_class_8_1_8991fb9c local_48;
  ErrorCallback local_40;
  ValidateOptions *local_20;
  ValidateOptions *options_local;
  Errors *errors_local;
  SharedValidator *this_local;
  
  bVar1 = (options->features).mutable_globals_enabled_;
  bVar2 = (options->features).sat_float_to_int_enabled_;
  bVar3 = (options->features).sign_extension_enabled_;
  bVar4 = (options->features).simd_enabled_;
  bVar5 = (options->features).threads_enabled_;
  bVar6 = (options->features).multi_value_enabled_;
  bVar7 = (options->features).tail_call_enabled_;
  (this->options_).features.exceptions_enabled_ = (options->features).exceptions_enabled_;
  (this->options_).features.mutable_globals_enabled_ = bVar1;
  (this->options_).features.sat_float_to_int_enabled_ = bVar2;
  (this->options_).features.sign_extension_enabled_ = bVar3;
  (this->options_).features.simd_enabled_ = bVar4;
  (this->options_).features.threads_enabled_ = bVar5;
  (this->options_).features.multi_value_enabled_ = bVar6;
  (this->options_).features.tail_call_enabled_ = bVar7;
  bVar1 = (options->features).reference_types_enabled_;
  bVar2 = (options->features).annotations_enabled_;
  bVar3 = (options->features).gc_enabled_;
  (this->options_).features.bulk_memory_enabled_ = (options->features).bulk_memory_enabled_;
  (this->options_).features.reference_types_enabled_ = bVar1;
  (this->options_).features.annotations_enabled_ = bVar2;
  (this->options_).features.gc_enabled_ = bVar3;
  this->errors_ = errors;
  local_20 = options;
  options_local = (ValidateOptions *)errors;
  errors_local = (Errors *)this;
  TypeChecker::TypeChecker(&this->typechecker_,&options->features);
  this->expr_loc_ = (Location *)0x0;
  this->num_types_ = 0;
  std::
  map<unsigned_int,_wabt::SharedValidator::FuncType,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wabt::SharedValidator::FuncType>_>_>
  ::map(&this->func_types_);
  std::
  map<unsigned_int,_wabt::SharedValidator::StructType,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wabt::SharedValidator::StructType>_>_>
  ::map(&this->struct_types_);
  std::
  map<unsigned_int,_wabt::SharedValidator::ArrayType,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wabt::SharedValidator::ArrayType>_>_>
  ::map(&this->array_types_);
  std::vector<wabt::SharedValidator::FuncType,_std::allocator<wabt::SharedValidator::FuncType>_>::
  vector(&this->funcs_);
  std::vector<wabt::SharedValidator::TableType,_std::allocator<wabt::SharedValidator::TableType>_>::
  vector(&this->tables_);
  std::vector<wabt::SharedValidator::MemoryType,_std::allocator<wabt::SharedValidator::MemoryType>_>
  ::vector(&this->memories_);
  std::vector<wabt::SharedValidator::GlobalType,_std::allocator<wabt::SharedValidator::GlobalType>_>
  ::vector(&this->globals_);
  std::vector<wabt::SharedValidator::EventType,_std::allocator<wabt::SharedValidator::EventType>_>::
  vector(&this->events_);
  std::vector<wabt::SharedValidator::ElemType,_std::allocator<wabt::SharedValidator::ElemType>_>::
  vector(&this->elems_);
  this->starts_ = 0;
  this->num_imported_globals_ = 0;
  this->data_segments_ = 0;
  std::vector<wabt::SharedValidator::LocalDecl,_std::allocator<wabt::SharedValidator::LocalDecl>_>::
  vector(&this->locals_);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set(&this->export_names_);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->declared_funcs_);
  std::vector<wabt::Var,_std::allocator<wabt::Var>_>::vector(&this->init_expr_funcs_);
  local_48.this = this;
  std::function<void(char_const*)>::
  function<wabt::SharedValidator::SharedValidator(std::vector<wabt::Error,std::allocator<wabt::Error>>*,wabt::ValidateOptions_const&)::__0,void>
            ((function<void(char_const*)> *)&local_40,&local_48);
  TypeChecker::set_error_callback(&this->typechecker_,&local_40);
  std::function<void_(const_char_*)>::~function(&local_40);
  return;
}

Assistant:

SharedValidator::SharedValidator(Errors* errors, const ValidateOptions& options)
    : options_(options), errors_(errors), typechecker_(options.features) {
  typechecker_.set_error_callback(
      [this](const char* msg) { OnTypecheckerError(msg); });
}